

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl.cpp
# Opt level: O2

Response * __thiscall
arbiter::http::Curl::get
          (Response *__return_storage_ptr__,Curl *this,string *path,Headers *headers,Query *query,
          size_t reserve,size_t timeout)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr this_00;
  int code;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  vector<char,_std::allocator<char>_> data;
  Headers receivedHeaders;
  string local_70 [32];
  string local_50 [32];
  
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (reserve != 0) {
    ::std::vector<char,_std::allocator<char>_>::reserve(&data,reserve);
  }
  ::std::__cxx11::string::string(local_70,(string *)path);
  init(this,(EVP_PKEY_CTX *)local_70);
  ::std::__cxx11::string::~string(local_70);
  if (timeout != 0) {
    curl_easy_setopt(this->m_curl,0x14,timeout);
  }
  curl_easy_setopt(this->m_curl,0x4e2b,anon_unknown_4::getCb);
  curl_easy_setopt(this->m_curl,0x2711,&data);
  curl_easy_setopt(this->m_curl,0x2727,this->m_headers);
  p_Var1 = &receivedHeaders._M_t._M_impl.super__Rb_tree_header;
  receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  curl_easy_setopt(this->m_curl,0x4e6f,anon_unknown_4::headerCb);
  curl_easy_setopt(this->m_curl,0x272d,&receivedHeaders);
  code = perform(this);
  for (p_Var3 = receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1;
      p_Var3 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
    this_00 = p_Var3 + 2;
    while ((p_Var2 = p_Var3[2]._M_parent, p_Var2 != (_Base_ptr)0x0 && (**(char **)this_00 == ' ')))
    {
      ::std::__cxx11::string::substr((ulong)local_50,(ulong)this_00);
      ::std::__cxx11::string::operator=((string *)this_00,local_50);
      ::std::__cxx11::string::~string(local_50);
    }
    while ((p_Var2 != (_Base_ptr)0x0 && (*(char *)(*(long *)this_00 + -1 + (long)p_Var2) == ' '))) {
      ::std::__cxx11::string::pop_back();
      p_Var2 = p_Var3[2]._M_parent;
    }
  }
  Response::Response(__return_storage_ptr__,code,&data,&receivedHeaders);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&receivedHeaders._M_t);
  ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&data.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

Response Curl::get(
        std::string path,
        Headers headers,
        Query query,
        const std::size_t reserve,
        const std::size_t timeout)
{
#ifdef ARBITER_CURL
    std::vector<char> data;

    if (reserve) data.reserve(reserve);

    init(path, headers, query);
    if (timeout) curl_easy_setopt(m_curl, CURLOPT_LOW_SPEED_TIME, timeout);

    // Register callback function and data pointer to consume the result.
    curl_easy_setopt(m_curl, CURLOPT_WRITEFUNCTION, getCb);
    curl_easy_setopt(m_curl, CURLOPT_WRITEDATA, &data);

    // Insert all headers into the request.
    curl_easy_setopt(m_curl, CURLOPT_HTTPHEADER, m_headers);

    // Set up callback and data pointer for received headers.
    Headers receivedHeaders;
    curl_easy_setopt(m_curl, CURLOPT_HEADERFUNCTION, headerCb);
    curl_easy_setopt(m_curl, CURLOPT_HEADERDATA, &receivedHeaders);

    // Run the command.
    const int httpCode(perform());

    for (auto& h : receivedHeaders)
    {
        std::string& v(h.second);
        while (v.size() && v.front() == ' ') v = v.substr(1);
        while (v.size() && v.back() == ' ') v.pop_back();
    }

    return Response(httpCode, data, receivedHeaders);
#else
    throw ArbiterError(fail);
#endif
}